

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

charcount_t Js::FunctionBody::SkipByteOrderMark(LPCUTF8 *documentStart)

{
  utf8char_t uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LPCUTF8 puVar5;
  long lVar6;
  
  puVar5 = *documentStart;
  if (puVar5 == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xa59,"(documentStart != nullptr)","documentStart != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    puVar5 = *documentStart;
  }
  uVar1 = *puVar5;
  if (uVar1 == 0xff) {
    lVar6 = 2;
    if (puVar5[1] != 0xfe) {
      return 0;
    }
  }
  else if (uVar1 == 0xfe) {
    if (puVar5[1] != 0xff) {
      return 0;
    }
    lVar6 = 2;
  }
  else {
    if (uVar1 != 0xef) {
      return 0;
    }
    if (puVar5[1] != 0xbb) {
      return 0;
    }
    lVar6 = 3;
    if (puVar5[2] != 0xbf) {
      return 0;
    }
  }
  *documentStart = puVar5 + lVar6;
  return 1;
}

Assistant:

static charcount_t SkipByteOrderMark(__in_bcount_z(4) LPCUTF8& documentStart)
        {
            charcount_t retValue = 0;

            Assert(documentStart != nullptr);

            if (documentStart[0] == 0xEF &&
                documentStart[1] == 0xBB &&
                documentStart[2] == 0xBF)
            {
                // UTF-8     - EF BB BF
                // 3 bytes skipped - reports one char skipped
                documentStart += 3;
                retValue = 1;
            }
            else if ((documentStart[0] == 0xFF && documentStart[1] == 0xFE) ||
                    (documentStart[0] == 0xFE && documentStart[1] == 0xFF))
            {
                // UTF-16 LE - FF FE
                // UTF-16 BE - FE FF
                // 2 bytes skipped - reports one char skipped
                documentStart += 2;
                retValue = 1;
            }

            return retValue;
        }